

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O3

void writeVTKfileFor2DintegerField(char *fileName,char *description,char **field,lattice *grid)

{
  FILE *__s;
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  __s = fopen(fileName,"w");
  if (__s != (FILE *)0x0) {
    fwrite("# vtk DataFile Version 3.0\n",0x1b,1,__s);
    fwrite("Scalar Field\n",0xd,1,__s);
    fwrite("ASCII\n",6,1,__s);
    fwrite("DATASET RECTILINEAR_GRID\n",0x19,1,__s);
    fprintf(__s,"DIMENSIONS %d %d 1\n",(ulong)(uint)grid->imax,(ulong)(uint)grid->jmax);
    fprintf(__s,"X_COORDINATES %d double\n",(ulong)(uint)grid->imax);
    if (0 < grid->imax) {
      dVar5 = 0.0;
      do {
        fprintf(__s,"%lf ",grid->delx * dVar5);
        dVar5 = dVar5 + 1.0;
      } while (dVar5 < (double)grid->imax);
    }
    fputc(10,__s);
    fprintf(__s,"Y_COORDINATES %d double\n",(ulong)(uint)grid->jmax);
    if (0 < grid->jmax) {
      dVar5 = 0.0;
      do {
        fprintf(__s,"%lf ",grid->dely * dVar5);
        dVar5 = dVar5 + 1.0;
      } while (dVar5 < (double)grid->jmax);
    }
    fputc(10,__s);
    fwrite("Z_COORDINATES 1 double\n",0x17,1,__s);
    fwrite("0.0\n",4,1,__s);
    fprintf(__s,"POINT_DATA %d\n",(ulong)(uint)(grid->jmax * grid->imax));
    fprintf(__s,"SCALARS %s double 1\n",description);
    fwrite("LOOKUP_TABLE default\n",0x15,1,__s);
    iVar2 = grid->delj;
    if (0 < iVar2) {
      uVar1 = (ulong)(uint)grid->deli;
      lVar4 = 0;
      do {
        if (0 < (int)uVar1) {
          lVar3 = 0;
          do {
            fprintf(__s,"%i\n",(ulong)(field[lVar3][lVar4] != '\x0f'));
            lVar3 = lVar3 + 1;
            uVar1 = (ulong)grid->deli;
          } while (lVar3 < (long)uVar1);
          iVar2 = grid->delj;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar2);
    }
    fputc(10,__s);
    fclose(__s);
    return;
  }
  return;
}

Assistant:

void writeVTKfileFor2DintegerField (const char* fileName, const char* description, char **field, lattice *grid)
{
	FILE* vtkFile = fopen(fileName, "w");
	if (vtkFile == NULL)
		return;

	fprintf(vtkFile, "# vtk DataFile Version 3.0\n");
	fprintf(vtkFile, "Scalar Field\n");
	fprintf(vtkFile, "ASCII\n");

	fprintf(vtkFile, "DATASET RECTILINEAR_GRID\n");
	fprintf(vtkFile, "DIMENSIONS %d %d 1\n", grid->imax, grid->jmax);
	fprintf(vtkFile, "X_COORDINATES %d double\n", grid->imax);
	for (REAL i = 0; i < grid->imax; i++)
		fprintf(vtkFile, "%lf ", grid->delx*i);
	fprintf(vtkFile, "\n");
	fprintf(vtkFile, "Y_COORDINATES %d double\n", grid->jmax);
	for (REAL j = 0; j < grid->jmax; j++)
		fprintf(vtkFile, "%lf ", grid->dely*j);
	fprintf(vtkFile, "\n");
	fprintf(vtkFile, "Z_COORDINATES 1 double\n");
	fprintf(vtkFile, "0.0\n");

	fprintf(vtkFile, "POINT_DATA %d\n", grid->imax * grid->jmax);
	fprintf(vtkFile, "SCALARS %s double 1\n", description);
	fprintf(vtkFile, "LOOKUP_TABLE default\n");
	for(int j = 0; j < grid->delj; j++)
	{
		for(int i = 0; i < grid->deli; i++)
		{
			fprintf(vtkFile, "%i\n", (field[i][j]!=C_F));
		}
	}
	fprintf(vtkFile,"\n");
	fclose(vtkFile);
	return;
}